

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesEncoder::EncodePortableAttributes
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  byte bVar1;
  uint uVar2;
  uint32_t dimension;
  pointer piVar3;
  PointDVectorIterator end;
  PointDVectorIterator end_00;
  PointDVectorIterator end_01;
  PointDVectorIterator end_02;
  PointDVectorIterator end_03;
  PointDVectorIterator end_04;
  PointDVectorIterator end_05;
  undefined1 auVar4 [24];
  undefined1 auVar5 [24];
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  undefined1 auVar9 [24];
  undefined1 auVar10 [24];
  uchar uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  DataType DVar15;
  uint uVar16;
  _Head_base<0UL,_draco::PointAttribute_*,_false> this_00;
  uint uVar17;
  long lVar18;
  AttributeValueIndex AVar19;
  uint uVar20;
  ulong uVar21;
  PointIndex pi;
  ulong uVar22;
  ulong uVar23;
  uchar local_a11;
  EncoderBuffer *local_a10;
  allocator_type local_a01;
  int local_a00;
  int local_9fc;
  PointDVector<unsigned_int> point_vector;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_point;
  undefined4 uStack_98c;
  undefined4 uStack_974;
  undefined4 uStack_95c;
  undefined4 uStack_944;
  undefined4 uStack_92c;
  undefined4 uStack_914;
  undefined4 uStack_8fc;
  undefined4 uStack_8e4;
  undefined4 uStack_8cc;
  undefined4 uStack_8b4;
  undefined4 uStack_89c;
  undefined4 uStack_884;
  undefined4 uStack_86c;
  undefined4 uStack_854;
  vector<int,_std::allocator<int>_> signed_point;
  
  iVar13 = EncoderOptionsBase<int>::GetSpeed
                     (((this->super_AttributesEncoder).point_cloud_encoder_)->options_);
  iVar14 = 6;
  if (10 - iVar13 < 6) {
    iVar14 = 10 - iVar13;
  }
  uVar11 = (uchar)iVar14;
  local_a11 = '\x05';
  if (this->num_components_ < 0x10) {
    local_a11 = uVar11;
  }
  if (uVar11 != '\x06') {
    local_a11 = uVar11;
  }
  local_a10 = out_buffer;
  EncoderBuffer::Encode<unsigned_char>(out_buffer,&local_a11);
  uVar2 = ((this->super_AttributesEncoder).point_cloud_encoder_)->point_cloud_->num_points_;
  uVar23 = (ulong)uVar2;
  PointDVector<unsigned_int>::PointDVector(&point_vector,uVar2,this->num_components_);
  uVar17 = 0;
  local_9fc = 0;
  local_a00 = 0;
  uVar20 = 0;
  while( true ) {
    piVar3 = (this->super_AttributesEncoder).point_attribute_ids_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((uint)((ulong)((long)(this->super_AttributesEncoder).point_attribute_ids_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar3) >> 2) <= uVar17)
    break;
    this_00._M_head_impl =
         *(PointAttribute **)
          &(((this->super_AttributesEncoder).point_cloud_encoder_)->point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[piVar3[(int)uVar17]]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
    DVar15 = *(DataType *)((long)this_00._M_head_impl + 0x1c);
    if (5 < DVar15 - DT_INT8) {
      if ((DVar15 != DT_FLOAT32) ||
         (this_00._M_head_impl =
               *(PointAttribute **)
                &(this->quantized_portable_attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_a00]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t, this_00._M_head_impl == (PointAttribute *)0x0))
      goto switchD_0015a9a6_default;
      local_a00 = local_a00 + 1;
      DVar15 = *(DataType *)((long)this_00._M_head_impl + 0x1c);
    }
    switch(DVar15) {
    case DT_INT8:
    case DT_INT16:
    case DT_INT32:
      std::vector<int,_std::allocator<int>_>::vector
                (&signed_point,
                 (ulong)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                 (allocator_type *)&unsigned_point);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&unsigned_point,
                 (ulong)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                 &local_a01);
      lVar18 = (long)local_9fc;
      for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
        AVar19.value_ = (uint)uVar22;
        if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_ ==
            '\0') {
          AVar19.value_ =
               *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)->buffer_
                        + uVar22 * 4);
        }
        GeometryAttribute::ConvertValue<int>
                  (&(this_00._M_head_impl)->super_GeometryAttribute,AVar19,
                   signed_point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        bVar1 = *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18);
        piVar3 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar21 = 0; bVar1 != uVar21; uVar21 = uVar21 + 1) {
          *(int *)(CONCAT44(unsigned_point.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)unsigned_point.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + uVar21 * 4) =
               signed_point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21] - piVar3[lVar18 + uVar21];
        }
        memcpy(point_vector.data0_ +
               (ulong)(point_vector.dimensionality_ * (uint)uVar22) + (ulong)uVar20,
               (void *)CONCAT44(unsigned_point.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)unsigned_point.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start),(ulong)bVar1 << 2);
      }
      local_9fc = local_9fc +
                  (uint)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&signed_point.super__Vector_base<int,_std::allocator<int>_>);
      break;
    default:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&signed_point,
                 (ulong)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                 (allocator_type *)&unsigned_point);
      for (uVar22 = 0; uVar23 != uVar22; uVar22 = uVar22 + 1) {
        AVar19.value_ = (uint)uVar22;
        if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_ !=
            '\x01') {
          AVar19.value_ =
               *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)->buffer_
                        + uVar22 * 4);
        }
        GeometryAttribute::ConvertValue<unsigned_int>
                  (&(this_00._M_head_impl)->super_GeometryAttribute,AVar19,
                   (uint *)signed_point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
        memcpy(point_vector.data0_ +
               (ulong)(point_vector.dimensionality_ * (uint)uVar22) + (ulong)uVar20,
               signed_point.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (ulong)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18) <<
               2);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&signed_point);
      break;
    case DT_UINT32:
      for (uVar22 = 0; uVar23 != uVar22; uVar22 = uVar22 + 1) {
        uVar16 = (uint)uVar22;
        if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_ !=
            '\x01') {
          uVar16 = *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)->
                                   buffer_ + uVar22 * 4);
        }
        memcpy(point_vector.data0_ +
               (ulong)(point_vector.dimensionality_ * (uint)uVar22) + (ulong)uVar20,
               (void *)((ulong)uVar16 *
                        *(int64_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x28)
                        + **(long **)&(this_00._M_head_impl)->super_GeometryAttribute +
                       *(int64_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x30)),
               (ulong)*(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18) <<
               2);
      }
    }
    uVar20 = uVar20 + *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18);
    uVar17 = uVar17 + 1;
  }
  dimension = this->num_components_;
  uVar22 = 0;
  uVar23 = (ulong)(uVar2 * dimension);
  if ((int)(uVar2 * dimension) < 1) {
    uVar23 = uVar22;
  }
  iVar14 = 0;
  for (; uVar23 != uVar22; uVar22 = uVar22 + 1) {
    uVar2 = point_vector.data0_[uVar22];
    if (uVar2 != 0) {
      uVar17 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      if (iVar14 <= (int)uVar17) {
        iVar14 = (uVar17 ^ 0xffffffe0) + 0x21;
      }
    }
  }
  switch(local_a11) {
  case '\0':
    DynamicIntegerPointsKdTreeEncoder<0>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<0> *)&signed_point,dimension);
    end._20_4_ = uStack_98c;
    end.dimensionality_ = point_vector.dimensionality_;
    auVar4._12_4_ = uStack_974;
    auVar4._8_4_ = point_vector.dimensionality_;
    auVar4._0_8_ = &point_vector;
    auVar4._16_8_ = 0;
    end.vec_ = &point_vector;
    end.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<0>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<0> *)&signed_point,
                        (PointDVectorIterator)(auVar4 << 0x40),end,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<0>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<0> *)&signed_point);
    break;
  case '\x01':
    DynamicIntegerPointsKdTreeEncoder<1>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<1> *)&signed_point,dimension);
    end_03._20_4_ = uStack_95c;
    end_03.dimensionality_ = point_vector.dimensionality_;
    auVar8._12_4_ = uStack_944;
    auVar8._8_4_ = point_vector.dimensionality_;
    auVar8._0_8_ = &point_vector;
    auVar8._16_8_ = 0;
    end_03.vec_ = &point_vector;
    end_03.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<1>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<1> *)&signed_point,
                        (PointDVectorIterator)(auVar8 << 0x40),end_03,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<1>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<1> *)&signed_point);
    break;
  case '\x02':
    DynamicIntegerPointsKdTreeEncoder<2>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<2> *)&signed_point,dimension);
    end_01._20_4_ = uStack_92c;
    end_01.dimensionality_ = point_vector.dimensionality_;
    auVar6._12_4_ = uStack_914;
    auVar6._8_4_ = point_vector.dimensionality_;
    auVar6._0_8_ = &point_vector;
    auVar6._16_8_ = 0;
    end_01.vec_ = &point_vector;
    end_01.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<2>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<2> *)&signed_point,
                        (PointDVectorIterator)(auVar6 << 0x40),end_01,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<2>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<2> *)&signed_point);
    break;
  case '\x03':
    DynamicIntegerPointsKdTreeEncoder<3>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<3> *)&signed_point,dimension);
    end_02._20_4_ = uStack_8fc;
    end_02.dimensionality_ = point_vector.dimensionality_;
    auVar7._12_4_ = uStack_8e4;
    auVar7._8_4_ = point_vector.dimensionality_;
    auVar7._0_8_ = &point_vector;
    auVar7._16_8_ = 0;
    end_02.vec_ = &point_vector;
    end_02.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<3>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<3> *)&signed_point,
                        (PointDVectorIterator)(auVar7 << 0x40),end_02,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<3>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<3> *)&signed_point);
    break;
  case '\x04':
    DynamicIntegerPointsKdTreeEncoder<4>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<4> *)&signed_point,dimension);
    end_00._20_4_ = uStack_8cc;
    end_00.dimensionality_ = point_vector.dimensionality_;
    auVar5._12_4_ = uStack_8b4;
    auVar5._8_4_ = point_vector.dimensionality_;
    auVar5._0_8_ = &point_vector;
    auVar5._16_8_ = 0;
    end_00.vec_ = &point_vector;
    end_00.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<4>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<4> *)&signed_point,
                        (PointDVectorIterator)(auVar5 << 0x40),end_00,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<4>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<4> *)&signed_point);
    break;
  case '\x05':
    DynamicIntegerPointsKdTreeEncoder<5>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<5> *)&signed_point,dimension);
    end_04._20_4_ = uStack_89c;
    end_04.dimensionality_ = point_vector.dimensionality_;
    auVar9._12_4_ = uStack_884;
    auVar9._8_4_ = point_vector.dimensionality_;
    auVar9._0_8_ = &point_vector;
    auVar9._16_8_ = 0;
    end_04.vec_ = &point_vector;
    end_04.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<5>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<5> *)&signed_point,
                        (PointDVectorIterator)(auVar9 << 0x40),end_04,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<5>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<5> *)&signed_point);
    break;
  case '\x06':
    DynamicIntegerPointsKdTreeEncoder<6>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<6> *)&signed_point,dimension);
    end_05._20_4_ = uStack_86c;
    end_05.dimensionality_ = point_vector.dimensionality_;
    auVar10._12_4_ = uStack_854;
    auVar10._8_4_ = point_vector.dimensionality_;
    auVar10._0_8_ = &point_vector;
    auVar10._16_8_ = 0;
    end_05.vec_ = &point_vector;
    end_05.item_ = (ulong)point_vector.n_items_;
    unsigned_point.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar14;
    bVar12 = DynamicIntegerPointsKdTreeEncoder<6>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<6> *)&signed_point,
                        (PointDVectorIterator)(auVar10 << 0x40),end_05,(uint32_t *)&unsigned_point,
                        local_a10);
    DynamicIntegerPointsKdTreeEncoder<6>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<6> *)&signed_point);
    break;
  default:
    goto switchD_0015a9a6_default;
  }
  if (bVar12 == false) {
switchD_0015a9a6_default:
    bVar12 = false;
  }
  else {
    bVar12 = true;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&point_vector.data_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar12;
}

Assistant:

bool KdTreeAttributesEncoder::EncodePortableAttributes(
    EncoderBuffer *out_buffer) {
  // Encode the data using the kd tree encoder algorithm. The data is first
  // copied to a PointDVector that provides all the API expected by the core
  // encoding algorithm.

  // We limit the maximum value of compression_level to 6 as we don't currently
  // have viable algorithms for higher compression levels.
  uint8_t compression_level =
      std::min(10 - encoder()->options()->GetSpeed(), 6);
  DRACO_DCHECK_LE(compression_level, 6);

  if (compression_level == 6 && num_components_ > 15) {
    // Don't use compression level for CL >= 6. Axis selection is currently
    // encoded using 4 bits.
    compression_level = 5;
  }

  out_buffer->Encode(compression_level);

  // Init PointDVector. The number of dimensions is equal to the total number
  // of dimensions across all attributes.
  const int num_points = encoder()->point_cloud()->num_points();
  PointDVector<uint32_t> point_vector(num_points, num_components_);

  int num_processed_components = 0;
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Copy data to the point vector.
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    const PointAttribute *source_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8 || att->data_type() == DT_INT32 ||
        att->data_type() == DT_INT16 || att->data_type() == DT_INT8) {
      // Use the original attribute.
      source_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Use the portable (quantized) attribute instead.
      source_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();
      num_processed_quantized_attributes++;
    } else {
      // Unsupported data type.
      return false;
    }

    if (source_att == nullptr) {
      return false;
    }

    // Copy source_att to the vector.
    if (source_att->data_type() == DT_UINT32) {
      // If the data type is the same as the one used by the point vector, we
      // can directly copy individual elements.
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        const uint8_t *const att_value_address = source_att->GetAddress(avi);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   att_value_address);
      }
    } else if (source_att->data_type() == DT_INT32 ||
               source_att->data_type() == DT_INT16 ||
               source_att->data_type() == DT_INT8) {
      // Signed values need to be converted to unsigned before they are stored
      // in the point vector.
      std::vector<int32_t> signed_point(source_att->num_components());
      std::vector<uint32_t> unsigned_point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<int32_t>(avi, &signed_point[0]);
        for (int c = 0; c < source_att->num_components(); ++c) {
          unsigned_point[c] =
              signed_point[c] -
              min_signed_values_[num_processed_signed_components + c];
        }

        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   &unsigned_point[0]);
      }
      num_processed_signed_components += source_att->num_components();
    } else {
      // If the data type of the attribute is different, we have to convert the
      // value before we put it to the point vector.
      std::vector<uint32_t> point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<uint32_t>(avi, &point[0]);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   point.data());
      }
    }
    num_processed_components += source_att->num_components();
  }

  // Compute the maximum bit length needed for the kd tree encoding.
  int num_bits = 0;
  const uint32_t *data = point_vector[0];
  for (int i = 0; i < num_points * num_components_; ++i) {
    if (data[i] > 0) {
      const int msb = MostSignificantBit(data[i]) + 1;
      if (msb > num_bits) {
        num_bits = msb;
      }
    }
  }

  switch (compression_level) {
    case 6: {
      DynamicIntegerPointsKdTreeEncoder<6> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 5: {
      DynamicIntegerPointsKdTreeEncoder<5> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 4: {
      DynamicIntegerPointsKdTreeEncoder<4> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 3: {
      DynamicIntegerPointsKdTreeEncoder<3> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 2: {
      DynamicIntegerPointsKdTreeEncoder<2> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 1: {
      DynamicIntegerPointsKdTreeEncoder<1> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 0: {
      DynamicIntegerPointsKdTreeEncoder<0> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    // Compression level and/or encoding speed seem wrong.
    default:
      return false;
  }
  return true;
}